

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_cs_example.cc
# Opt level: O0

void GEN_CS::gen_cs_example_dm(multi_ex *examples,label *cs_labels)

{
  bool bVar1;
  v_array<COST_SENSITIVE::wclass> *this;
  v_array<COST_SENSITIVE::wclass> *pvVar2;
  size_t sVar3;
  cb_class *pcVar4;
  wclass *pwVar5;
  v_array<COST_SENSITIVE::wclass> *in_RSI;
  vector<example_*,_std::allocator<example_*>_> *in_RDI;
  wclass wc;
  label ld;
  uint32_t i;
  bool shared;
  wclass *in_stack_ffffffffffffffa8;
  v_array<COST_SENSITIVE::wclass> *in_stack_ffffffffffffffb0;
  example *in_stack_ffffffffffffffc8;
  uint local_18;
  
  v_array<COST_SENSITIVE::wclass>::clear(in_stack_ffffffffffffffb0);
  std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RDI,0);
  bVar1 = CB::ec_is_example_header(in_stack_ffffffffffffffc8);
  local_18 = 0;
  while( true ) {
    this = (v_array<COST_SENSITIVE::wclass> *)(ulong)local_18;
    pvVar2 = (v_array<COST_SENSITIVE::wclass> *)
             std::vector<example_*,_std::allocator<example_*>_>::size(in_RDI);
    if (pvVar2 <= this) break;
    std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RDI,(ulong)local_18);
    sVar3 = v_array<CB::cb_class>::size((v_array<CB::cb_class> *)&stack0xffffffffffffffc8);
    if (sVar3 == 1) {
      pcVar4 = v_array<CB::cb_class>::operator[]
                         ((v_array<CB::cb_class> *)&stack0xffffffffffffffc8,0);
      if ((pcVar4->cost != 3.4028235e+38) || (NAN(pcVar4->cost))) {
        v_array<CB::cb_class>::operator[]((v_array<CB::cb_class> *)&stack0xffffffffffffffc8,0);
      }
    }
    v_array<COST_SENSITIVE::wclass>::push_back(this,in_stack_ffffffffffffffa8);
    local_18 = local_18 + 1;
  }
  if (bVar1) {
    pwVar5 = v_array<COST_SENSITIVE::wclass>::operator[](in_RSI,0);
    pwVar5->class_index = 0;
    pwVar5 = v_array<COST_SENSITIVE::wclass>::operator[](in_RSI,0);
    pwVar5->x = -3.4028235e+38;
  }
  return;
}

Assistant:

void gen_cs_example_dm(multi_ex& examples, COST_SENSITIVE::label& cs_labels)
{
  cs_labels.costs.clear();
  bool shared = CB::ec_is_example_header(*examples[0]);
  for (uint32_t i = 0; i < examples.size(); i++)
  {
    CB::label ld = examples[i]->l.cb;

    COST_SENSITIVE::wclass wc = {0., i, 0., 0.};
    if (shared && i > 0)
      wc.class_index = (uint32_t)i - 1;
    if (ld.costs.size() == 1 && ld.costs[0].cost != FLT_MAX)
      wc.x = ld.costs[0].cost;
    cs_labels.costs.push_back(wc);
  }

  if (shared)  // take care of shared examples
  {
    cs_labels.costs[0].class_index = 0;
    cs_labels.costs[0].x = -FLT_MAX;
  }
}